

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_color _Var2;
  pointer pDVar3;
  _Alloc_hider _Var4;
  _Base_ptr p_Var5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  undefined8 uVar9;
  long lVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  int iVar14;
  _Rb_tree_node_base *p_Var15;
  SLNode<DictKey> *pSVar16;
  iterator iter;
  multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> lolz;
  skiplist<DictKey,_std::less<DictKey>_> aDict;
  undefined1 local_c80 [8];
  _Alloc_hider local_c78;
  SLNode<DictKey> *local_c70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c68;
  undefined1 local_c58 [8];
  _Alloc_hider local_c50;
  _Rb_tree_node_base *local_c48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c40;
  size_t local_c30;
  undefined1 *local_c28;
  long local_c20;
  undefined1 local_c18 [16];
  undefined1 *local_c08;
  long local_c00;
  undefined1 local_bf8 [16];
  undefined1 *local_be8;
  long local_be0;
  undefined1 local_bd8 [16];
  undefined1 *local_bc8;
  long local_bc0;
  undefined1 local_bb8 [16];
  undefined1 *local_ba8;
  long local_ba0;
  undefined1 local_b98 [16];
  undefined1 *local_b88;
  long local_b80;
  undefined1 local_b78 [16];
  undefined1 *local_b68;
  long local_b60;
  undefined1 local_b58 [16];
  undefined1 *local_b48;
  long local_b40;
  undefined1 local_b38 [16];
  undefined1 local_b28 [8];
  _Alloc_hider local_b20;
  char local_b10 [16];
  undefined1 local_b00 [8];
  _Alloc_hider local_af8;
  char local_ae8 [16];
  undefined1 local_ad8 [8];
  _Alloc_hider local_ad0;
  char local_ac0 [16];
  undefined1 local_ab0 [8];
  _Alloc_hider local_aa8;
  char local_a98 [16];
  DictKey local_a88;
  DictKey local_a60;
  skiplist<DictKey,_std::less<DictKey>_> local_a38;
  
  skiplist<DictKey,_std::less<DictKey>_>::skiplist(&local_a38);
  local_b48 = local_b38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"hello","");
  local_ab0._0_4_ = 10;
  local_aa8._M_p = local_a98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_aa8,local_b48,local_b48 + local_b40);
  skiplist<DictKey,_std::less<DictKey>_>::insert(&local_a38,(DictKey *)local_ab0);
  if (local_aa8._M_p != local_a98) {
    operator_delete(local_aa8._M_p);
  }
  if (local_b48 != local_b38) {
    operator_delete(local_b48);
  }
  local_b68 = local_b58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b68,"jello","");
  local_ad8._0_4_ = 0x14;
  local_ad0._M_p = local_ac0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_ad0,local_b68,local_b68 + local_b60);
  skiplist<DictKey,_std::less<DictKey>_>::insert(&local_a38,(DictKey *)local_ad8);
  if (local_ad0._M_p != local_ac0) {
    operator_delete(local_ad0._M_p);
  }
  if (local_b68 != local_b58) {
    operator_delete(local_b68);
  }
  local_b88 = local_b78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b88,"yello","");
  local_b00._0_4_ = 0x14;
  local_af8._M_p = local_ae8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_af8,local_b88,local_b88 + local_b80);
  skiplist<DictKey,_std::less<DictKey>_>::insert(&local_a38,(DictKey *)local_b00);
  if (local_af8._M_p != local_ae8) {
    operator_delete(local_af8._M_p);
  }
  if (local_b88 != local_b78) {
    operator_delete(local_b88);
  }
  local_ba8 = local_b98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba8,"fello","");
  local_b28._0_4_ = 0x28;
  local_b20._M_p = local_b10;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b20,local_ba8,local_ba8 + local_ba0);
  skiplist<DictKey,_std::less<DictKey>_>::insert(&local_a38,(DictKey *)local_b28);
  if (local_b20._M_p != local_b10) {
    operator_delete(local_b20._M_p);
  }
  if (local_ba8 != local_b98) {
    operator_delete(local_ba8);
  }
  operator<<((ostream *)&std::cout,&local_a38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SKIPLIST:\n",10);
  if ((local_a38.key.super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       local_a38.key.super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
       _M_impl.super__Vector_impl_data._M_finish) &&
     (pSVar16 = (*local_a38.key.
                  super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->next, pSVar16 != (SLNode<DictKey> *)0x0)) {
    iVar14 = pSVar16->count + -1;
    iVar7 = iVar14;
    do {
      iVar6 = iVar7 - iVar14;
      pDVar3 = (pSVar16->valz).super__Vector_base<DictKey,_std::allocator<DictKey>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_c58._0_4_ = pDVar3[iVar6].key_;
      _Var4._M_p = pDVar3[iVar6].value_._M_dataplus._M_p;
      local_c50._M_p = (pointer)&local_c40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c50,_Var4._M_p,_Var4._M_p + pDVar3[iVar6].value_._M_string_length)
      ;
      poVar8 = operator<<((ostream *)&std::cout,(DictKey *)local_c58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c50._M_p != &local_c40) {
        operator_delete(local_c50._M_p);
      }
      if (iVar14 == 0) {
        pSVar16 = pSVar16->next;
        if (pSVar16 == (SLNode<DictKey> *)0x0) {
          pSVar16 = (SLNode<DictKey> *)0x0;
          iVar14 = 0;
        }
        else {
          iVar14 = pSVar16->count + -1;
          iVar7 = iVar14;
        }
      }
      else {
        iVar14 = iVar14 + -1;
      }
    } while ((pSVar16 != (SLNode<DictKey> *)0x0) || (iVar14 != 0));
  }
  local_c50._M_p = (pointer)((ulong)local_c50._M_p._4_4_ << 0x20);
  local_c48 = (_Rb_tree_node_base *)0x0;
  local_c30 = 0;
  local_c40._M_allocated_capacity = (size_type)(_Rb_tree_node_base *)&local_c50;
  local_c40._8_8_ = (_Rb_tree_node_base *)&local_c50;
  local_bc8 = local_bb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc8,"hello","");
  local_c80._0_4_ = 10;
  local_c78._M_p = (pointer)&local_c68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c78,local_bc8,local_bc8 + local_bc0);
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::_M_insert_equal<DictKey>
            ((_Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
              *)local_c58,(DictKey *)local_c80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c78._M_p != &local_c68) {
    operator_delete(local_c78._M_p);
  }
  if (local_bc8 != local_bb8) {
    operator_delete(local_bc8);
  }
  local_be8 = local_bd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_be8,"jello","");
  local_c80._0_4_ = 0x14;
  local_c78._M_p = (pointer)&local_c68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c78,local_be8,local_be8 + local_be0);
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::_M_insert_equal<DictKey>
            ((_Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
              *)local_c58,(DictKey *)local_c80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c78._M_p != &local_c68) {
    operator_delete(local_c78._M_p);
  }
  if (local_be8 != local_bd8) {
    operator_delete(local_be8);
  }
  local_c08 = local_bf8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c08,"yello","");
  local_c80._0_4_ = 0x14;
  local_c78._M_p = (pointer)&local_c68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c78,local_c08,local_c08 + local_c00);
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::_M_insert_equal<DictKey>
            ((_Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
              *)local_c58,(DictKey *)local_c80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c78._M_p != &local_c68) {
    operator_delete(local_c78._M_p);
  }
  if (local_c08 != local_bf8) {
    operator_delete(local_c08);
  }
  local_c28 = local_c18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c28,"fello","");
  local_c80._0_4_ = 0x28;
  local_c78._M_p = (pointer)&local_c68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c78,local_c28,local_c28 + local_c20);
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::_M_insert_equal<DictKey>
            ((_Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
              *)local_c58,(DictKey *)local_c80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c78._M_p != &local_c68) {
    operator_delete(local_c78._M_p);
  }
  if (local_c28 != local_c18) {
    operator_delete(local_c28);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MULTISET:\n",10);
  if ((_Rb_tree_node_base *)local_c40._M_allocated_capacity != (_Rb_tree_node_base *)&local_c50) {
    uVar9 = local_c40._M_allocated_capacity;
    do {
      local_c80._0_4_ = ((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_color;
      local_c78._M_p = (pointer)&local_c68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c78,((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_parent,
                 (long)&((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_parent->_M_color +
                 (long)&((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_left->_M_color);
      poVar8 = operator<<((ostream *)&std::cout,(DictKey *)local_c80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c78._M_p != &local_c68) {
        operator_delete(local_c78._M_p);
      }
      uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9);
    } while ((_Rb_tree_node_base *)uVar9 != (_Rb_tree_node_base *)&local_c50);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MULTISET:\n",10);
  local_c80._0_4_ = 0x14;
  local_c78._M_p = (pointer)&local_c68;
  local_c70 = (SLNode<DictKey> *)0x0;
  local_c68._M_local_buf[0] = '\0';
  p_Var13 = (_Rb_tree_node_base *)&local_c50;
  p_Var15 = (_Rb_tree_node_base *)&local_c50;
  p_Var5 = local_c48;
  if (local_c48 != (_Rb_tree_node_base *)0x0) {
    do {
      p_Var11 = p_Var5;
      p_Var12 = p_Var13;
      _Var2 = p_Var11[1]._M_color;
      p_Var13 = p_Var11;
      if ((int)_Var2 < 0x14) {
        p_Var13 = p_Var12;
      }
      p_Var5 = (&p_Var11->_M_left)[(int)_Var2 < 0x14];
    } while ((&p_Var11->_M_left)[(int)_Var2 < 0x14] != (_Base_ptr)0x0);
    if (p_Var13 != (_Rb_tree_node_base *)&local_c50) {
      if ((int)_Var2 < 0x14) {
        p_Var11 = p_Var12;
      }
      if ((int)p_Var11[1]._M_color < 0x15) {
        p_Var15 = p_Var13;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found: ",7);
  poVar8 = operator<<((ostream *)&std::cout,(DictKey *)(p_Var15 + 1));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Next: ",6);
  lVar10 = std::_Rb_tree_increment(p_Var15);
  poVar8 = operator<<((ostream *)&std::cout,(DictKey *)(lVar10 + 0x20));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Count: ",7);
  local_c80._0_4_ = 0x14;
  local_c78._M_p = (pointer)&local_c68;
  local_c70 = (SLNode<DictKey> *)0x0;
  local_c68._M_local_buf[0] = '\0';
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::count((_Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
           *)local_c58,(key_type *)local_c80);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c78._M_p != &local_c68) {
    operator_delete(local_c78._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SKIPLIST:\n",10);
  paVar1 = &local_a60.value_.field_2;
  local_a60.key_ = 0x14;
  local_a60.value_._M_string_length = 0;
  local_a60.value_.field_2._M_local_buf[0] = '\0';
  local_a60.value_._M_dataplus._M_p = (pointer)paVar1;
  skiplist<DictKey,_std::less<DictKey>_>::find((iterator *)local_c80,&local_a38,&local_a60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_a60.value_._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found: ",7);
  poVar8 = operator<<((ostream *)&std::cout,
                      (local_c70->valz).super__Vector_base<DictKey,_std::allocator<DictKey>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      ((long)(int)local_c80._4_4_ - (long)(int)local_c80._0_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Next: ",6);
  if (local_c80._0_4_ == 0) {
    local_c70 = (&local_c70->back)[(byte)local_c78._M_p._0_1_ ^ 1];
    local_c80._0_4_ = local_c70->count + -1;
    local_c80._4_4_ = local_c80._0_4_;
  }
  else {
    local_c80._0_4_ = local_c80._0_4_ + -1;
  }
  poVar8 = operator<<((ostream *)&std::cout,
                      (local_c70->valz).super__Vector_base<DictKey,_std::allocator<DictKey>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      ((long)(int)local_c80._4_4_ - (long)(int)local_c80._0_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Count: ",7);
  paVar1 = &local_a88.value_.field_2;
  local_a88.key_ = 0x14;
  local_a88.value_._M_string_length = 0;
  local_a88.value_.field_2._M_local_buf[0] = '\0';
  local_a88.value_._M_dataplus._M_p = (pointer)paVar1;
  iVar7 = skiplist<DictKey,_std::less<DictKey>_>::count(&local_a38,&local_a88);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_a88.value_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::~_Rb_tree((_Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
               *)local_c58);
  skiplist<DictKey,_std::less<DictKey>_>::~skiplist(&local_a38);
  return 0;
}

Assistant:

int main() {
  skiplist<DictKey> aDict;

  aDict.insert({10, "hello"});
  aDict.insert({20, "jello"});
  aDict.insert({20, "yello"});
  aDict.insert({40, "fello"});

  std::cout << aDict;

  // foundit(aDict, DictKey{10});
  // foundit(aDict, DictKey{20});
  // foundit(aDict, DictKey{30});
  std::cout << "SKIPLIST:\n";
  for(auto e: aDict)
    std::cout << e << "\n";

  // same operations on multiset
  std::multiset<DictKey> lolz;
  lolz.insert({10, "hello"});
  lolz.insert({20, "jello"});
  lolz.insert({20, "yello"});
  lolz.insert({40, "fello"});

  std::cout << "MULTISET:\n";
  for(auto e: lolz)
    std::cout << e << "\n";

  // what about a find?
  // returns the first element inserted apparently
  std::cout << "MULTISET:\n";
  auto it = lolz.find(20);
  std::cout << "Found: " << *it << "\n";
  std::cout << "Next: " << *++it << "\n";
  std::cout << "Count: " << lolz.count(20) << "\n";

  // now to repeat it with our data structure
  std::cout << "SKIPLIST:\n";
  auto iter = aDict.find(20);
  std::cout << "Found: " << *iter << "\n";
  std::cout << "Next: " << *++iter << "\n";
  std::cout << "Count: " << aDict.count(20) << "\n";

  return 0;
}